

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_util.cc
# Opt level: O0

uint64_t bloaty::dwarf::ReadLEB128Internal(bool is_signed,string_view *data)

{
  byte bVar1;
  size_type sVar2;
  const_pointer pvVar3;
  byte *pbVar4;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  byte in_DIL;
  char byte;
  char *limit;
  char *ptr;
  int maxshift;
  int shift;
  uint64_t ret;
  uint in_stack_ffffffffffffffbc;
  uint line;
  byte *str;
  byte *local_28;
  int local_1c;
  ulong local_18;
  
  local_18 = 0;
  local_1c = 0;
  local_28 = (byte *)std::basic_string_view<char,_std::char_traits<char>_>::data(in_RSI);
  str = local_28;
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(in_RSI);
  while( true ) {
    line = in_stack_ffffffffffffffbc & 0xffffff;
    if (local_28 < str + sVar2) {
      line = CONCAT13(local_1c < 0x46,(int3)in_stack_ffffffffffffffbc);
    }
    if ((char)(line >> 0x18) == '\0') break;
    pbVar4 = local_28 + 1;
    bVar1 = *local_28;
    local_18 = (long)(int)((int)(char)bVar1 & 0x7f) << ((byte)local_1c & 0x3f) | local_18;
    local_1c = local_1c + 7;
    in_stack_ffffffffffffffbc = line;
    local_28 = pbVar4;
    if (((int)(char)bVar1 & 0x80U) == 0) {
      pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data(in_RSI);
      std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                (in_RSI,(long)pbVar4 - (long)pvVar3);
      if ((((in_DIL & 1) != 0) && (local_1c < 0x40)) && ((bVar1 & 0x40) != 0)) {
        local_18 = -(1L << ((byte)local_1c & 0x3f)) | local_18;
      }
      return local_18;
    }
  }
  Throw((char *)str,line);
}

Assistant:

uint64_t ReadLEB128Internal(bool is_signed, string_view* data) {
  uint64_t ret = 0;
  int shift = 0;
  int maxshift = 70;
  const char* ptr = data->data();
  const char* limit = ptr + data->size();

  while (ptr < limit && shift < maxshift) {
    char byte = *(ptr++);
    ret |= static_cast<uint64_t>(byte & 0x7f) << shift;
    shift += 7;
    if ((byte & 0x80) == 0) {
      data->remove_prefix(ptr - data->data());
      if (is_signed && shift < 64 && (byte & 0x40)) {
        ret |= -(1ULL << shift);
      }
      return ret;
    }
  }

  THROW("corrupt DWARF data, unterminated LEB128");
}